

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

LegacyScriptPubKeyMan * __thiscall wallet::CWallet::GetLegacyScriptPubKeyMan(CWallet *this)

{
  long lVar1;
  bool bVar2;
  pointer ppVar3;
  long in_FS_OFFSET;
  const_iterator it;
  _Rb_tree_const_iterator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>
  *in_stack_ffffffffffffffa8;
  map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
  *in_stack_ffffffffffffffb0;
  CWallet *in_stack_ffffffffffffffb8;
  LegacyScriptPubKeyMan *local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = IsWalletFlagSet(in_stack_ffffffffffffffb8,(uint64_t)in_stack_ffffffffffffffb0);
  if (bVar2) {
    local_28 = (LegacyScriptPubKeyMan *)0x0;
  }
  else {
    std::
    map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
    ::find(in_stack_ffffffffffffffb0,(key_type *)in_stack_ffffffffffffffa8);
    std::
    map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
    ::end(in_stack_ffffffffffffffb0);
    bVar2 = std::operator==((_Self *)in_stack_ffffffffffffffb8,(_Self *)in_stack_ffffffffffffffb0);
    if (bVar2) {
      local_28 = (LegacyScriptPubKeyMan *)0x0;
    }
    else {
      ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>
               ::operator->(in_stack_ffffffffffffffa8);
      if (ppVar3->second == (ScriptPubKeyMan *)0x0) {
        local_28 = (LegacyScriptPubKeyMan *)0x0;
      }
      else {
        local_28 = (LegacyScriptPubKeyMan *)
                   __dynamic_cast(ppVar3->second,&ScriptPubKeyMan::typeinfo,
                                  &LegacyScriptPubKeyMan::typeinfo,0);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_28;
}

Assistant:

LegacyScriptPubKeyMan* CWallet::GetLegacyScriptPubKeyMan() const
{
    if (IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)) {
        return nullptr;
    }
    // Legacy wallets only have one ScriptPubKeyMan which is a LegacyScriptPubKeyMan.
    // Everything in m_internal_spk_managers and m_external_spk_managers point to the same legacyScriptPubKeyMan.
    auto it = m_internal_spk_managers.find(OutputType::LEGACY);
    if (it == m_internal_spk_managers.end()) return nullptr;
    return dynamic_cast<LegacyScriptPubKeyMan*>(it->second);
}